

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

MemoryTypeAddressPair map_address(Address addr)

{
  MemoryTypeAddressPair MVar1;
  byte bStack_11;
  MemoryTypeAddressPair MStack_10;
  Address addr_local;
  
  switch(addr >> 0xc) {
  case 0:
  case 1:
  case 2:
  case 3:
    MStack_10 = make_pair(MEMORY_MAP_ROM0,addr & 0x3fff);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    MStack_10 = make_pair(MEMORY_MAP_ROM1,addr & 0x3fff);
    break;
  case 8:
  case 9:
    MStack_10 = make_pair(MEMORY_MAP_VRAM,addr & 0x1fff);
    break;
  case 10:
  case 0xb:
    MStack_10 = make_pair(MEMORY_MAP_EXT_RAM,addr & 0x1fff);
    break;
  case 0xc:
  case 0xe:
    MStack_10 = make_pair(MEMORY_MAP_WORK_RAM0,addr & 0xfff);
    break;
  case 0xd:
    MStack_10 = make_pair(MEMORY_MAP_WORK_RAM1,addr & 0xfff);
    break;
  default:
    bStack_11 = (byte)(addr >> 8);
    if ((bStack_11 & 0xf) == 0xe) {
      if (addr < 0xfea0) {
        MStack_10 = make_pair(MEMORY_MAP_OAM,addr + 0x200);
      }
      else {
        MStack_10 = make_pair(MEMORY_MAP_UNUSED,addr);
      }
    }
    else if ((bStack_11 & 0xf) == 0xf) {
      switch(addr >> 4 & 0xf) {
      case 0:
      case 4:
      case 5:
      case 6:
      case 7:
        MStack_10 = make_pair(MEMORY_MAP_IO,addr + 0x100);
        break;
      case 1:
      case 2:
        MStack_10 = make_pair(MEMORY_MAP_APU,addr + 0xf0);
        break;
      case 3:
        MStack_10 = make_pair(MEMORY_MAP_WAVE_RAM,addr + 0xd0);
        break;
      case 0xf:
        if (addr == 0xffff) {
          MVar1 = make_pair(MEMORY_MAP_IO,0xff);
          return MVar1;
        }
      default:
        MStack_10 = make_pair(MEMORY_MAP_HIGH_RAM,addr + 0x80);
      }
    }
    else {
      MStack_10 = make_pair(MEMORY_MAP_WORK_RAM1,addr & 0xfff);
    }
  }
  return MStack_10;
}

Assistant:

static MemoryTypeAddressPair map_address(Address addr) {
  switch (addr >> 12) {
    case 0x0: case 0x1: case 0x2: case 0x3:
      return make_pair(MEMORY_MAP_ROM0, addr & ADDR_MASK_16K);
    case 0x4: case 0x5: case 0x6: case 0x7:
      return make_pair(MEMORY_MAP_ROM1, addr & ADDR_MASK_16K);
    case 0x8: case 0x9:
      return make_pair(MEMORY_MAP_VRAM, addr & ADDR_MASK_8K);
    case 0xA: case 0xB:
      return make_pair(MEMORY_MAP_EXT_RAM, addr & ADDR_MASK_8K);
    case 0xC: case 0xE: /* mirror of 0xc000..0xcfff */
      return make_pair(MEMORY_MAP_WORK_RAM0, addr & ADDR_MASK_4K);
    case 0xD:
      return make_pair(MEMORY_MAP_WORK_RAM1, addr & ADDR_MASK_4K);
    default: case 0xF:
      switch ((addr >> 8) & 0xf) {
        default: /* 0xf000 - 0xfdff: mirror of 0xd000-0xddff */
          return make_pair(MEMORY_MAP_WORK_RAM1, addr & ADDR_MASK_4K);
        case 0xe:
          if (addr <= OAM_END_ADDR) { /* 0xfe00 - 0xfe9f */
            return make_pair(MEMORY_MAP_OAM, addr - OAM_START_ADDR);
          } else { /* 0xfea0 - 0xfeff */
            return make_pair(MEMORY_MAP_UNUSED, addr);
          }
          break;
        case 0xf:
          switch ((addr >> 4) & 0xf) {
            case 0: case 4: case 5: case 6: case 7:
              /* 0xff00 - 0xff0f, 0xff40 - 0xff7f */
              return make_pair(MEMORY_MAP_IO, addr - IO_START_ADDR);
            case 1: case 2: /* 0xff10 - 0xff2f */
              return make_pair(MEMORY_MAP_APU, addr - APU_START_ADDR);
            case 3: /* 0xff30 - 0xff3f */
              return make_pair(MEMORY_MAP_WAVE_RAM, addr - WAVE_RAM_START_ADDR);
            case 0xf:
              if (addr == IE_ADDR) {
                return make_pair(MEMORY_MAP_IO, addr - IO_START_ADDR);
              }
              /* fallthrough */
            default: /* 0xff80 - 0xfffe */
              return make_pair(MEMORY_MAP_HIGH_RAM, addr - HIGH_RAM_START_ADDR);
          }
      }
  }
}